

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_buffered_read_char(sexp ctx,sexp p)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int __fd;
  size_t sVar4;
  ssize_t sVar5;
  long in_RSI;
  long in_RDI;
  int res;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp origbytes;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp_conflict in_stack_000001f0;
  sexp_conflict in_stack_000001f8;
  sexp_conflict in_stack_00000200;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  sexp in_stack_ffffffffffffffa0;
  sexp in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  sexp *local_48;
  undefined8 local_40;
  sexp local_38;
  sexp *local_30;
  undefined8 local_28;
  sexp local_20;
  long local_18;
  long local_10;
  uint local_4;
  
  local_20 = (sexp)0x43e;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  local_38 = (sexp)0x43e;
  memset(&local_48,0,0x10);
  if (*(ulong *)(local_18 + 0x38) < *(ulong *)(local_18 + 0x50)) {
    lVar1 = *(long *)(local_18 + 0x38);
    *(long *)(local_18 + 0x38) = lVar1 + 1;
    local_4 = (uint)*(byte *)(*(long *)(local_18 + 0x28) + lVar1);
  }
  else if (*(char *)(local_18 + 0x30) == '\0') {
    local_4 = 0xffffffff;
  }
  else if (*(long *)(local_18 + 0x20) == 0) {
    if (((*(ulong *)(local_18 + 0x18) & 3) == 0) && (**(int **)(local_18 + 0x18) == 0x12)) {
      if (*(long *)(local_18 + 0x20) == 0) {
        if (((*(ulong *)(local_18 + 0x18) & 3) == 0) && (**(int **)(local_18 + 0x18) == 0x12)) {
          __fd = (int)*(undefined8 *)(*(long *)(local_18 + 0x18) + 0x10);
        }
        else {
          __fd = -1;
        }
      }
      else {
        __fd = fileno(*(FILE **)(local_18 + 0x20));
      }
      sVar5 = read(__fd,(void *)(*(long *)(local_18 + 0x28) + 4),0xffc);
      local_4 = (uint)sVar5;
      if (-1 < (int)local_4) {
        *(undefined8 *)(local_18 + 0x38) = 4;
        *(long *)(local_18 + 0x50) = (long)(int)(local_4 + 4);
        if (*(ulong *)(local_18 + 0x38) < *(ulong *)(local_18 + 0x50)) {
          lVar1 = *(long *)(local_18 + 0x38);
          *(long *)(local_18 + 0x38) = lVar1 + 1;
          local_4 = (uint)*(byte *)(*(long *)(local_18 + 0x28) + lVar1);
        }
        else {
          local_4 = 0xffffffff;
        }
      }
    }
    else if (((*(ulong *)(local_18 + 0x10) & 3) == 0) &&
            ((**(int **)(local_18 + 0x10) == 10 && (*(long *)(*(long *)(local_18 + 0x10) + 8) == 6))
            )) {
      local_30 = &local_20;
      local_28 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp ***)(local_10 + 0x6080) = &local_30;
      local_48 = &local_38;
      local_40 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp ***)(local_10 + 0x6080) = &local_48;
      local_20 = sexp_list2((sexp)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
      if (*(char *)(local_18 + 0x32) == '\0') {
        local_38 = *(sexp *)(*(long *)(local_18 + 0x10) + 0x18);
      }
      else {
        local_38 = *(sexp *)(*(long *)(*(long *)(local_18 + 0x10) + 0x18) + 8);
      }
      local_20 = sexp_cons_op(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),local_38
                              ,(sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_20 = sexp_apply(in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
      if ((((ulong)local_20 & 1) == 1) &&
         (auVar2._8_8_ = (long)local_20 >> 0x3f, auVar2._0_8_ = (ulong)local_20 & 0xfffffffffffffffe
         , 4 < SUB168(auVar2 / SEXT816(2),0))) {
        *(undefined8 *)(local_18 + 0x38) = 4;
        auVar3._8_8_ = (long)local_20 >> 0x3f;
        auVar3._0_8_ = (ulong)local_20 & 0xfffffffffffffffe;
        *(long *)(local_18 + 0x50) = SUB168(auVar3 / SEXT816(2),0);
        if ((*(char *)(local_18 + 0x32) == '\0') &&
           (local_38 != *(sexp *)(*(long *)(*(long *)(local_18 + 0x10) + 0x18) + 8))) {
          memcpy(*(void **)(local_18 + 0x28),
                 (void *)(*(long *)(*(long *)(*(long *)(local_18 + 0x10) + 0x18) + 8) + 0x10 +
                         *(long *)(*(long *)(*(long *)(local_18 + 0x10) + 0x18) + 0x10)),
                 *(size_t *)(local_18 + 0x50));
        }
        if (*(ulong *)(local_18 + 0x38) < *(ulong *)(local_18 + 0x50)) {
          lVar1 = *(long *)(local_18 + 0x38);
          *(long *)(local_18 + 0x38) = lVar1 + 1;
          local_4 = (uint)*(byte *)(*(long *)(local_18 + 0x28) + lVar1);
        }
        else {
          local_4 = 0xffffffff;
        }
      }
      else {
        local_4 = 0xffffffff;
        *(undefined8 *)(local_18 + 0x50) = 0;
      }
      *(undefined8 *)(local_10 + 0x6080) = local_28;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    sVar4 = fread((void *)(*(long *)(local_18 + 0x28) + 4),1,0xffc,*(FILE **)(local_18 + 0x20));
    local_4 = (uint)sVar4;
    if (-1 < (int)local_4) {
      *(undefined8 *)(local_18 + 0x38) = 4;
      *(long *)(local_18 + 0x50) = (long)(int)(local_4 + 4);
      if (*(ulong *)(local_18 + 0x38) < *(ulong *)(local_18 + 0x50)) {
        lVar1 = *(long *)(local_18 + 0x38);
        *(long *)(local_18 + 0x38) = lVar1 + 1;
        local_4 = (uint)*(byte *)(*(long *)(local_18 + 0x28) + lVar1);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
  }
  return local_4;
}

Assistant:

int sexp_buffered_read_char (sexp ctx, sexp p) {
  sexp_gc_var2(tmp, origbytes);
  int res = 0;
  if (sexp_port_offset(p) < sexp_port_size(p)) {
    return ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++];
  } else if (!sexp_port_openp(p)) {
    return EOF;
  } else if (sexp_port_stream(p)) {
    res = fread(sexp_port_buf(p) + BUF_START, 1, SEXP_PORT_BUFFER_SIZE - BUF_START, sexp_port_stream(p));
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_filenop(sexp_port_fd(p))) {
    res = read(sexp_port_fileno(p), sexp_port_buf(p) + BUF_START, SEXP_PORT_BUFFER_SIZE - BUF_START);
    if (res >= 0) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = res + BUF_START;
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    }
  } else if (sexp_port_customp(p)) {
    sexp_gc_preserve2(ctx, tmp, origbytes);
    tmp = sexp_list2(ctx, sexp_make_fixnum(BUF_START), sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE));
    origbytes = sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS ? sexp_string_bytes(sexp_port_buffer(p)) : sexp_port_buffer(p);
    tmp = sexp_cons(ctx, origbytes, tmp);
    tmp = sexp_apply(ctx, sexp_port_reader(p), tmp);
    if (sexp_fixnump(tmp) && sexp_unbox_fixnum(tmp) > BUF_START) {
      sexp_port_offset(p) = BUF_START;
      sexp_port_size(p) = sexp_unbox_fixnum(tmp);
      if (!sexp_port_binaryp(p) && !SEXP_USE_PACKED_STRINGS
          && origbytes != sexp_string_bytes(sexp_port_buffer(p))) {
        /* handle resize */
        memcpy(sexp_port_buf(p), sexp_string_data(sexp_port_buffer(p)), sexp_port_size(p));
      }
      res = ((sexp_port_offset(p) < sexp_port_size(p))
             ? ((unsigned char*)sexp_port_buf(p))[sexp_port_offset(p)++] : EOF);
    } else {
      res = EOF;
      sexp_port_size(p) = 0;
    }
    sexp_gc_release2(ctx);
  } else {
    res = EOF;
  }
  return res;
}